

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

SSTable * __thiscall SSTable::get(SSTable *this,string *fileName,uint64_t key)

{
  char *pcVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  runtime_error *this_00;
  allocator local_2ba;
  undefined1 local_2b9;
  char *local_2b8;
  char *buf;
  allocator local_2a5;
  int local_2a4;
  uint64_t uStack_2a0;
  int _offset;
  uint64_t _key;
  uint64_t i;
  int valueSize;
  int offset;
  uint64_t length;
  char local_278 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258 [48];
  ifstream local_228 [8];
  ifstream in;
  uint64_t key_local;
  string *fileName_local;
  string *value;
  
  _Var3 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(local_228,(string *)fileName,_Var3);
  bVar2 = std::ios::fail();
  if ((bVar2 & 1) != 0) {
    length._7_1_ = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(local_278,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "readDic: Open file ");
    std::operator+(local_258,local_278);
    std::runtime_error::runtime_error(this_00,(string *)local_258);
    length._7_1_ = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::seekg((long)local_228,8);
  read64(local_228,(uint64_t *)&valueSize);
  std::istream::seekg((long)local_228,0x2820);
  i._4_4_ = -1;
  i._0_4_ = -1;
  _key = 0;
  do {
    if (_valueSize <= _key) {
LAB_00112aaf:
      if (i._4_4_ < 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)this,"",&local_2a5);
        std::allocator<char>::~allocator((allocator<char> *)&local_2a5);
      }
      else {
        std::istream::seekg((long)local_228,i._4_4_ + 0x282c + (int)_valueSize * 0xc);
        local_2b8 = (char *)operator_new__((long)((int)i + 1));
        std::istream::read((char *)local_228,(long)local_2b8);
        pcVar1 = local_2b8;
        local_2b8[(int)i] = '\0';
        local_2b9 = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)this,pcVar1,&local_2ba);
        std::allocator<char>::~allocator((allocator<char> *)&local_2ba);
        if (local_2b8 != (char *)0x0) {
          operator_delete__(local_2b8);
        }
        std::ifstream::close();
        local_2b9 = 1;
      }
      buf._4_4_ = 1;
      std::ifstream::~ifstream(local_228);
      return this;
    }
    read64(local_228,&stack0xfffffffffffffd60);
    read32(local_228,&local_2a4);
    if (uStack_2a0 == key) {
      i._4_4_ = local_2a4;
      read64(local_228,&stack0xfffffffffffffd60);
      read32(local_228,&local_2a4);
      i._0_4_ = local_2a4 - i._4_4_;
      goto LAB_00112aaf;
    }
    _key = _key + 1;
  } while( true );
}

Assistant:

string SSTable::get(const string &fileName, uint64_t key) {
  ifstream in(fileName, ios_base::in | ios_base::binary);
  if (in.fail())
    throw runtime_error("readDic: Open file " + fileName + " failed!");

  in.seekg(8, ifstream::beg);  // skip timeStamp
  uint64_t length;
  read64(in, length);
  in.seekg(10272, ifstream::beg);  // skip header and bloomFilter

  int offset = -1;
  int valueSize = -1;
  for (uint64_t i = 0; i < length; i++) {
    uint64_t _key;
    int _offset;
    read64(in, _key);
    read32(in, _offset);
    if (_key == key) {
      offset = _offset;
      read64(in, _key);
      read32(in, _offset);
      valueSize = _offset - offset;
      break;
    }
  }
  if (offset < 0) return "";
  in.seekg(10272 + (length + 1) * 12 + offset, ifstream::beg);
  char *buf = new char[valueSize + 1];
  in.read(buf, valueSize);
  buf[valueSize] = '\0';
  string value(buf);
  delete[] buf;

  in.close();
  return value;
}